

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O2

RegisterKind arm::register_type(Reg r)

{
  RegisterKind RVar1;
  
  if (r < 0x10) {
    return GeneralPurpose;
  }
  if (r < 0x30) {
    RVar1 = DoubleVector;
  }
  else if (r < 0x40) {
    RVar1 = QuadVector;
  }
  else {
    if ((int)r < 0) {
      return VirtualQuadVector - (r < 0xc0000000);
    }
    RVar1 = VirtualGeneralPurpose;
  }
  return RVar1;
}

Assistant:

RegisterKind register_type(Reg r) {
  if (r < 16)
    return RegisterKind::GeneralPurpose;
  else if (r < 48)
    return RegisterKind::DoubleVector;
  else if (r < 64)
    return RegisterKind::QuadVector;
  else if (r < 1 << 31)
    return RegisterKind::VirtualGeneralPurpose;
  else if (r < 3 << 30)
    return RegisterKind::VirtualDoubleVector;
  else
    return RegisterKind::VirtualQuadVector;
}